

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::TreeEnsembleParameters_TreeNode_EvaluationInfo::MergeFrom
          (TreeEnsembleParameters_TreeNode_EvaluationInfo *this,
          TreeEnsembleParameters_TreeNode_EvaluationInfo *from)

{
  ulong uVar1;
  LogMessage *other;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O3/mlmodel/format/TreeEnsemble.pb.cc"
               ,0x1a4);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  if (from->evaluationindex_ != 0) {
    this->evaluationindex_ = from->evaluationindex_;
  }
  if (from->evaluationvalue_ != 0.0) {
    this->evaluationvalue_ = from->evaluationvalue_;
  }
  uVar1 = (from->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar1 & 0xfffffffffffffffc) + 8));
  }
  return;
}

Assistant:

void TreeEnsembleParameters_TreeNode_EvaluationInfo::MergeFrom(const TreeEnsembleParameters_TreeNode_EvaluationInfo& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.TreeEnsembleParameters.TreeNode.EvaluationInfo)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  if (from._internal_evaluationindex() != 0) {
    _internal_set_evaluationindex(from._internal_evaluationindex());
  }
  static_assert(sizeof(uint64_t) == sizeof(double), "Code assumes uint64_t and double are the same size.");
  double tmp_evaluationvalue = from._internal_evaluationvalue();
  uint64_t raw_evaluationvalue;
  memcpy(&raw_evaluationvalue, &tmp_evaluationvalue, sizeof(tmp_evaluationvalue));
  if (raw_evaluationvalue != 0) {
    _internal_set_evaluationvalue(from._internal_evaluationvalue());
  }
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}